

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

bool __thiscall
ON_Viewport::GetViewPlane(ON_Viewport *this,double view_plane_depth,ON_Plane *view_plane)

{
  bool bVar1;
  bool local_59;
  ON_3dVector local_58;
  ON_3dPoint local_40;
  bool local_21;
  ON_Plane *pOStack_20;
  bool rc;
  ON_Plane *view_plane_local;
  double view_plane_depth_local;
  ON_Viewport *this_local;
  
  pOStack_20 = view_plane;
  view_plane_local = (ON_Plane *)view_plane_depth;
  view_plane_depth_local = (double)this;
  bVar1 = IsValidFrustum(this);
  local_59 = false;
  if (bVar1) {
    local_59 = IsValidCamera(this);
  }
  local_21 = local_59;
  if (local_59 != false) {
    ::operator*(&local_58,(double)view_plane_local,&this->m_CamZ);
    ON_3dPoint::operator-(&local_40,&this->m_CamLoc,&local_58);
    (pOStack_20->origin).x = local_40.x;
    (pOStack_20->origin).y = local_40.y;
    (pOStack_20->origin).z = local_40.z;
    (pOStack_20->xaxis).x = (this->m_CamX).x;
    (pOStack_20->xaxis).y = (this->m_CamX).y;
    (pOStack_20->xaxis).z = (this->m_CamX).z;
    (pOStack_20->yaxis).x = (this->m_CamY).x;
    (pOStack_20->yaxis).y = (this->m_CamY).y;
    (pOStack_20->yaxis).z = (this->m_CamY).z;
    (pOStack_20->zaxis).x = (this->m_CamZ).x;
    (pOStack_20->zaxis).y = (this->m_CamZ).y;
    (pOStack_20->zaxis).z = (this->m_CamZ).z;
    ON_Plane::UpdateEquation(pOStack_20);
  }
  return (bool)(local_21 & 1);
}

Assistant:

bool ON_Viewport::GetViewPlane( 
  double view_plane_depth,
  ON_Plane& view_plane 
  ) const
{
  bool rc = IsValidFrustum() && IsValidCamera();
  if ( rc ) 
  {
    view_plane.origin = m_CamLoc - view_plane_depth*m_CamZ;
    view_plane.xaxis = m_CamX;
    view_plane.yaxis = m_CamY;
    view_plane.zaxis = m_CamZ;
    view_plane.UpdateEquation();
  }
  return rc;
}